

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase86::run(TestCase86 *this)

{
  bool bVar1;
  int local_238;
  bool local_231;
  int local_230;
  DebugExpression<int> DStack_22c;
  bool _kj_shouldLog_8;
  undefined1 local_228 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_8;
  int local_1f8;
  DebugExpression<int> DStack_1f4;
  bool _kj_shouldLog_7;
  undefined1 local_1f0 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_7;
  int local_1c0;
  DebugExpression<int> DStack_1bc;
  bool _kj_shouldLog_6;
  undefined1 local_1b8 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_6;
  int local_188;
  DebugExpression<int> DStack_184;
  bool _kj_shouldLog_5;
  undefined1 local_180 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_5;
  int local_150;
  DebugExpression<int> DStack_14c;
  bool _kj_shouldLog_4;
  undefined1 local_148 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_4;
  int local_118;
  DebugExpression<int> DStack_114;
  bool _kj_shouldLog_3;
  undefined1 local_110 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_3;
  int local_e0;
  DebugExpression<int> DStack_dc;
  bool _kj_shouldLog_2;
  undefined1 local_d8 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_2;
  int local_a8;
  DebugExpression<int> DStack_a4;
  bool _kj_shouldLog_1;
  undefined1 local_a0 [8];
  DebugComparison<int,_unsigned_char_&> _kjCondition_1;
  unsigned_long local_70;
  bool local_61;
  unsigned_long uStack_60;
  bool _kj_shouldLog;
  unsigned_long local_58;
  DebugExpression<unsigned_long> local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  WireValue<uint64_t>_conflict *vals;
  byte bytes [8];
  TestCase86 *this_local;
  
  vals = (WireValue<uint64_t>_conflict *)0xf0debc9a78563412;
  _kjCondition._32_8_ = &vals;
  local_58 = 0xf0debc9a78563412;
  bytes = (byte  [8])this;
  local_50 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  uStack_60 = ShiftingWireValue<unsigned_long,_8UL>::get
                        ((ShiftingWireValue<unsigned_long,_8UL> *)_kjCondition._32_8_);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_48,&local_50,
             &stack0xffffffffffffffa0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    local_61 = kj::_::Debug::shouldLog(ERROR);
    while (local_61 != false) {
      local_70 = 0xf0debc9a78563412;
      _kjCondition_1._32_8_ =
           ShiftingWireValue<unsigned_long,_8UL>::get
                     ((ShiftingWireValue<unsigned_long,_8UL> *)_kjCondition._32_8_);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x5b,ERROR,
                 "\"failed: expected \" \"(0xf0debc9a78563412) == (vals[0].get())\", _kjCondition, 0xf0debc9a78563412, vals[0].get()"
                 ,(char (*) [57])"failed: expected (0xf0debc9a78563412) == (vals[0].get())",
                 (DebugComparison<unsigned_long,_unsigned_long> *)local_48,&local_70,
                 (unsigned_long *)&_kjCondition_1.result);
      local_61 = false;
    }
  }
  ShiftingWireValue<unsigned_long,_8UL>::set
            ((ShiftingWireValue<unsigned_long,_8UL> *)_kjCondition._32_8_,0x23456789abcdef01);
  local_a8 = 1;
  DStack_a4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_a0,&stack0xffffffffffffff5c,
             (uchar *)&vals);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      _kjCondition_2.result = true;
      _kjCondition_2._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x5f,ERROR,
                 "\"failed: expected \" \"(0x01) == (bytes[0])\", _kjCondition, 0x01, bytes[0]",
                 (char (*) [38])"failed: expected (0x01) == (bytes[0])",
                 (DebugComparison<int,_unsigned_char_&> *)local_a0,(int *)&_kjCondition_2.result,
                 (uchar *)&vals);
      _kjCondition_2._39_1_ = 0;
    }
  }
  local_e0 = 0xef;
  DStack_dc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_d8,&stack0xffffffffffffff24,
             (uchar *)((long)&vals + 1));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d8);
  if (!bVar1) {
    _kjCondition_3._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._39_1_ != '\0') {
      _kjCondition_3.result = true;
      _kjCondition_3._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x60,ERROR,
                 "\"failed: expected \" \"(0xef) == (bytes[1])\", _kjCondition, 0xef, bytes[1]",
                 (char (*) [38])"failed: expected (0xef) == (bytes[1])",
                 (DebugComparison<int,_unsigned_char_&> *)local_d8,(int *)&_kjCondition_3.result,
                 (uchar *)((long)&vals + 1));
      _kjCondition_3._39_1_ = 0;
    }
  }
  local_118 = 0xcd;
  DStack_114 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_118);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_110,&stack0xfffffffffffffeec,
             (uchar *)((long)&vals + 2));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_110);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      _kjCondition_4.result = true;
      _kjCondition_4._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x61,ERROR,
                 "\"failed: expected \" \"(0xcd) == (bytes[2])\", _kjCondition, 0xcd, bytes[2]",
                 (char (*) [38])"failed: expected (0xcd) == (bytes[2])",
                 (DebugComparison<int,_unsigned_char_&> *)local_110,(int *)&_kjCondition_4.result,
                 (uchar *)((long)&vals + 2));
      _kjCondition_4._39_1_ = 0;
    }
  }
  local_150 = 0xab;
  DStack_14c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_150);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_148,&stack0xfffffffffffffeb4,
             (uchar *)((long)&vals + 3));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_148);
  if (!bVar1) {
    _kjCondition_5._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_5._39_1_ != '\0') {
      _kjCondition_5.result = true;
      _kjCondition_5._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x62,ERROR,
                 "\"failed: expected \" \"(0xab) == (bytes[3])\", _kjCondition, 0xab, bytes[3]",
                 (char (*) [38])"failed: expected (0xab) == (bytes[3])",
                 (DebugComparison<int,_unsigned_char_&> *)local_148,(int *)&_kjCondition_5.result,
                 (uchar *)((long)&vals + 3));
      _kjCondition_5._39_1_ = 0;
    }
  }
  local_188 = 0x89;
  DStack_184 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_188);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_180,&stack0xfffffffffffffe7c,
             (uchar *)((long)&vals + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
  if (!bVar1) {
    _kjCondition_6._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._39_1_ != '\0') {
      _kjCondition_6.result = true;
      _kjCondition_6._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,99,ERROR,
                 "\"failed: expected \" \"(0x89) == (bytes[4])\", _kjCondition, 0x89, bytes[4]",
                 (char (*) [38])"failed: expected (0x89) == (bytes[4])",
                 (DebugComparison<int,_unsigned_char_&> *)local_180,(int *)&_kjCondition_6.result,
                 (uchar *)((long)&vals + 4));
      _kjCondition_6._39_1_ = 0;
    }
  }
  local_1c0 = 0x67;
  DStack_1bc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1c0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_1b8,&stack0xfffffffffffffe44,
             (uchar *)((long)&vals + 5));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b8);
  if (!bVar1) {
    _kjCondition_7._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_7._39_1_ != '\0') {
      _kjCondition_7.result = true;
      _kjCondition_7._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,100,ERROR,
                 "\"failed: expected \" \"(0x67) == (bytes[5])\", _kjCondition, 0x67, bytes[5]",
                 (char (*) [38])"failed: expected (0x67) == (bytes[5])",
                 (DebugComparison<int,_unsigned_char_&> *)local_1b8,(int *)&_kjCondition_7.result,
                 (uchar *)((long)&vals + 5));
      _kjCondition_7._39_1_ = 0;
    }
  }
  local_1f8 = 0x45;
  DStack_1f4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1f8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_1f0,&stack0xfffffffffffffe0c,
             (uchar *)((long)&vals + 6));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f0);
  if (!bVar1) {
    _kjCondition_8._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._39_1_ != '\0') {
      _kjCondition_8.result = true;
      _kjCondition_8._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x65,ERROR,
                 "\"failed: expected \" \"(0x45) == (bytes[6])\", _kjCondition, 0x45, bytes[6]",
                 (char (*) [38])"failed: expected (0x45) == (bytes[6])",
                 (DebugComparison<int,_unsigned_char_&> *)local_1f0,(int *)&_kjCondition_8.result,
                 (uchar *)((long)&vals + 6));
      _kjCondition_8._39_1_ = 0;
    }
  }
  local_230 = 0x23;
  DStack_22c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_230);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char_&> *)local_228,&stack0xfffffffffffffdd4,
             (uchar *)((long)&vals + 7));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_228);
  if (!bVar1) {
    local_231 = kj::_::Debug::shouldLog(ERROR);
    while (local_231 != false) {
      local_238 = 0x23;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<int,unsigned_char&>&,int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x66,ERROR,
                 "\"failed: expected \" \"(0x23) == (bytes[7])\", _kjCondition, 0x23, bytes[7]",
                 (char (*) [38])"failed: expected (0x23) == (bytes[7])",
                 (DebugComparison<int,_unsigned_char_&> *)local_228,&local_238,
                 (uchar *)((long)&vals + 7));
      local_231 = false;
    }
  }
  return;
}

Assistant:

TEST(Endian, EightBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78, 0x9a, 0xbc, 0xde, 0xf0};

  WireValue<uint64_t>* vals = reinterpret_cast<WireValue<uint64_t>*>(bytes);

  EXPECT_EQ(0xf0debc9a78563412, vals[0].get());

  vals[0].set(0x23456789abcdef01);

  EXPECT_EQ(0x01, bytes[0]);
  EXPECT_EQ(0xef, bytes[1]);
  EXPECT_EQ(0xcd, bytes[2]);
  EXPECT_EQ(0xab, bytes[3]);
  EXPECT_EQ(0x89, bytes[4]);
  EXPECT_EQ(0x67, bytes[5]);
  EXPECT_EQ(0x45, bytes[6]);
  EXPECT_EQ(0x23, bytes[7]);
}